

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O1

void check_readonly(LexState *ls,expdesc *e)

{
  expkind eVar1;
  FuncState *pFVar2;
  Vardesc *pVVar3;
  long lVar4;
  Upvaldesc *pUVar5;
  char *msg;
  TString *pTVar6;
  
  pFVar2 = ls->fs;
  eVar1 = e->k;
  if (eVar1 == VLOCAL) {
    pVVar3 = (pFVar2->ls->dyd->actvar).arr;
    lVar4 = (long)pFVar2->firstlocal + (ulong)(e->u).var.vidx;
    if (*(char *)((long)pVVar3 + lVar4 * 0x18 + 9) == '\0') {
LAB_0014b1c4:
      pTVar6 = (TString *)0x0;
      goto LAB_0014b1c6;
    }
    pUVar5 = (Upvaldesc *)&(&pVVar3->vd)[lVar4].name;
  }
  else if (eVar1 == VUPVAL) {
    pUVar5 = pFVar2->f->upvalues;
    if (pUVar5[(e->u).info].kind == '\0') goto LAB_0014b1c4;
    pUVar5 = pUVar5 + (e->u).info;
  }
  else {
    if (eVar1 != VCONST) {
      return;
    }
    pUVar5 = (Upvaldesc *)&(&((ls->dyd->actvar).arr)->vd)[(e->u).info].name;
  }
  pTVar6 = pUVar5->name;
LAB_0014b1c6:
  if (pTVar6 == (TString *)0x0) {
    return;
  }
  msg = luaO_pushfstring(ls->L,"attempt to assign to const variable \'%s\'",pTVar6->contents);
  luaK_semerror(ls,msg);
}

Assistant:

static void check_readonly (LexState *ls, expdesc *e) {
  FuncState *fs = ls->fs;
  TString *varname = NULL;  /* to be set if variable is const */
  switch (e->k) {
    case VCONST: {
      varname = ls->dyd->actvar.arr[e->u.info].vd.name;
      break;
    }
    case VLOCAL: {
      Vardesc *vardesc = getlocalvardesc(fs, e->u.var.vidx);
      if (vardesc->vd.kind != VDKREG)  /* not a regular variable? */
        varname = vardesc->vd.name;
      break;
    }
    case VUPVAL: {
      Upvaldesc *up = &fs->f->upvalues[e->u.info];
      if (up->kind != VDKREG)
        varname = up->name;
      break;
    }
    default:
      return;  /* other cases cannot be read-only */
  }
  if (varname) {
    const char *msg = luaO_pushfstring(ls->L,
       "attempt to assign to const variable '%s'", getstr(varname));
    luaK_semerror(ls, msg);  /* error */
  }
}